

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O1

void WriteLispStringToPipe(LispPTR lispstr)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar6;
  char *pcVar7;
  DLword *pDVar8;
  long lVar9;
  uint uVar10;
  unsigned_short len;
  undefined2 local_1a;
  long lVar5;
  
  uVar3 = (ulong)lispstr;
  if ((lispstr & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar3);
  }
  pDVar8 = Lisp_world;
  iVar2 = *(int *)(Lisp_world + uVar3 + 4);
  iVar4 = 0x800;
  if (iVar2 < 0x800) {
    iVar4 = iVar2;
  }
  lVar5 = (long)iVar4;
  if ((char)Lisp_world[uVar3 + 3] == 'D') {
    if (iVar2 == 0) {
      pcVar7 = shcom;
    }
    else {
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pDVar8 = Lisp_world +
               (ulong)Lisp_world[uVar3 + 2] + (ulong)(*(uint *)(Lisp_world + uVar3) & 0xfffffff);
      pcVar7 = shcom;
      do {
        *pcVar7 = *(char *)((ulong)pDVar8 ^ 2);
        pcVar7 = pcVar7 + 1;
        pDVar8 = pDVar8 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    *pcVar7 = '\0';
  }
  else if ((char)Lisp_world[uVar3 + 3] == 'C') {
    if (iVar2 != 0) {
      uVar10 = *(uint *)(Lisp_world + uVar3);
      uVar1 = Lisp_world[uVar3 + 2];
      lVar9 = 0;
      do {
        shcom[lVar9] = *(char *)((long)pDVar8 +
                                 lVar9 + (ulong)uVar1 + (ulong)(uVar10 & 0xfffffff) * 2 ^ 3);
        lVar9 = lVar9 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar9);
    }
    shcom[lVar5] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  sVar6 = strlen(shcom);
  uVar10 = (int)sVar6 + 1;
  local_1a = (undefined2)uVar10;
  write(UnixPipeOut,&local_1a,2);
  write(UnixPipeOut,shcom,(ulong)(uVar10 & 0xffff));
  return;
}

Assistant:

void WriteLispStringToPipe(LispPTR lispstr) {
  unsigned short len;
  LispStringToCString(lispstr, shcom, 2048);
  /* Write string length, then string */
  len = strlen(shcom) + 1;
  write(UnixPipeOut, &len, 2);
  write(UnixPipeOut, shcom, len);
}